

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_> *
getPluckerCoord<float>
          (vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           *__return_storage_ptr__,
          pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          *lPair)

{
  pointer *ppMVar1;
  float *pfVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  iterator __position;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  float fVar9;
  float fVar11;
  float fVar12;
  undefined1 auVar10 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar17;
  undefined1 auVar16 [16];
  float fVar18;
  float fVar19;
  Matrix<float,_6,_1,_0,_6,_1> l2;
  Matrix<float,_6,_1,_0,_6,_1> l1;
  float local_80;
  ulong local_7c;
  float local_74;
  ulong local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  Matrix<float,_6,_1,_0,_6,_1> local_48;
  Matrix<float,_6,_1,_0,_6,_1> local_30;
  
  fVar12 = (lPair->first).first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
           m_storage.m_data.array[0];
  local_74 = (lPair->first).second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[0] - fVar12;
  uVar4 = *(undefined8 *)
           ((lPair->first).first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array + 1);
  uVar5 = *(undefined8 *)
           ((lPair->first).second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array + 1);
  fVar18 = (float)uVar4;
  fVar15 = (float)uVar5 - fVar18;
  fVar19 = (float)((ulong)uVar4 >> 0x20);
  fVar17 = (float)((ulong)uVar5 >> 0x20) - fVar19;
  auVar16._0_8_ = CONCAT44(fVar17,fVar15);
  auVar16._8_8_ = 0;
  fVar3 = (lPair->second).first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[0];
  local_80 = (lPair->second).second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[0] - fVar3;
  uVar4 = *(undefined8 *)
           ((lPair->second).first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array + 1);
  uVar5 = *(undefined8 *)
           ((lPair->second).second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array + 1);
  fVar13 = (float)uVar4;
  fVar9 = (float)uVar5 - fVar13;
  fVar14 = (float)((ulong)uVar4 >> 0x20);
  fVar11 = (float)((ulong)uVar5 >> 0x20) - fVar14;
  auVar10._0_8_ = CONCAT44(fVar11,fVar9);
  auVar10._8_8_ = 0;
  fVar15 = fVar17 * fVar17 + fVar15 * fVar15 + local_74 * local_74;
  if (0.0 < fVar15) {
    fVar15 = SQRT(fVar15);
    local_74 = local_74 / fVar15;
    auVar7._4_4_ = fVar15;
    auVar7._0_4_ = fVar15;
    auVar7._8_4_ = fVar15;
    auVar7._12_4_ = fVar15;
    auVar16 = divps(auVar16,auVar7);
  }
  fVar9 = fVar11 * fVar11 + fVar9 * fVar9 + local_80 * local_80;
  if (0.0 < fVar9) {
    fVar9 = SQRT(fVar9);
    local_80 = local_80 / fVar9;
    auVar6._4_4_ = fVar9;
    auVar6._0_4_ = fVar9;
    auVar6._8_4_ = fVar9;
    auVar6._12_4_ = fVar9;
    auVar10 = divps(auVar10,auVar6);
  }
  fVar9 = (float)(auVar16._0_8_ >> 0x20);
  local_50 = local_74 * fVar18 - fVar12 * (float)auVar16._0_8_;
  local_58 = CONCAT44(fVar12 * fVar9 - local_74 * fVar19,
                      fVar19 * (float)auVar16._0_8_ - fVar9 * fVar18);
  fVar12 = (float)(auVar10._0_8_ >> 0x20);
  local_60 = local_80 * fVar13 - fVar3 * (float)auVar10._0_8_;
  local_68 = CONCAT44(fVar3 * fVar12 - local_80 * fVar14,
                      fVar14 * (float)auVar10._0_8_ - fVar12 * fVar13);
  local_7c = auVar10._0_8_;
  local_70 = auVar16._0_8_;
  memcpy(&local_30,&local_74,0xc);
  pfVar2 = local_30.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array + 3;
  uVar8 = -((uint)((ulong)pfVar2 >> 2) & 0x3fffffff) & 3;
  if (uVar8 == 0) {
    auVar10._0_8_ = 0;
LAB_0019ad96:
    memcpy((void *)((long)local_30.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array + auVar10._0_8_ + 0xc),
           (void *)((long)&local_58 + auVar10._0_8_),0xc - auVar10._0_8_);
  }
  else {
    auVar10._0_8_ = (ulong)(uVar8 * 4);
    memcpy(pfVar2,&local_58,auVar10._0_8_);
    if (uVar8 != 3) goto LAB_0019ad96;
  }
  uVar8 = -((uint)((ulong)&local_48 >> 2) & 0x3fffffff) & 3;
  if (uVar8 == 0) {
    auVar10._0_8_ = 0;
LAB_0019adea:
    memcpy((void *)((long)local_48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array + auVar10._0_8_),
           (void *)((long)&local_80 + auVar10._0_8_),0xc - auVar10._0_8_);
  }
  else {
    auVar10._0_8_ = (ulong)(uVar8 * 4);
    memcpy(&local_48,&local_80,auVar10._0_8_);
    if (uVar8 != 3) goto LAB_0019adea;
  }
  pfVar2 = local_48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array + 3;
  uVar8 = -((uint)((ulong)pfVar2 >> 2) & 0x3fffffff) & 3;
  if (uVar8 == 0) {
    auVar10._0_8_ = 0;
  }
  else {
    auVar10._0_8_ = (ulong)(uVar8 * 4);
    memcpy(pfVar2,&local_68,auVar10._0_8_);
    if (uVar8 == 3) goto LAB_0019ae59;
  }
  memcpy((void *)((long)local_48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array + auVar10._0_8_ + 0xc),
         (void *)((long)&local_68 + auVar10._0_8_),0xc - auVar10._0_8_);
LAB_0019ae59:
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Eigen::Matrix<float,6,1,0,6,1>,std::allocator<Eigen::Matrix<float,6,1,0,6,1>>>::
  _M_realloc_insert<Eigen::Matrix<float,6,1,0,6,1>const&>
            ((vector<Eigen::Matrix<float,6,1,0,6,1>,std::allocator<Eigen::Matrix<float,6,1,0,6,1>>>
              *)__return_storage_ptr__,(iterator)0x0,&local_30);
  __position._M_current =
       (__return_storage_ptr__->
       super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Eigen::Matrix<float,6,1,0,6,1>,std::allocator<Eigen::Matrix<float,6,1,0,6,1>>>::
    _M_realloc_insert<Eigen::Matrix<float,6,1,0,6,1>const&>
              ((vector<Eigen::Matrix<float,6,1,0,6,1>,std::allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                *)__return_storage_ptr__,__position,&local_48);
  }
  else {
    *(undefined8 *)
     (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
      m_storage.m_data.array + 4) =
         local_48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
         ._16_8_;
    *(undefined8 *)
     ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
     m_storage.m_data.array =
         local_48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
         ._0_8_;
    *(undefined8 *)
     (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
      m_storage.m_data.array + 2) =
         local_48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
         ._8_8_;
    ppMVar1 = &(__return_storage_ptr__->
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 6,1>> getPluckerCoord(std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> lPair){

	// get line normalized direction
	Eigen::Matrix<floatPrec,3,1> dir1 = lPair.first.second.head(3) - lPair.first.first.head(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lPair.second.second.head(3) - lPair.second.first.head(3);
	dir1.normalize();
	dir2.normalize();
	// get moment vectors
	Eigen::Matrix<floatPrec,3,1> p1 = lPair.first.first.head(3);
	Eigen::Matrix<floatPrec,3,1> m1 = dir1.cross(p1);
	Eigen::Matrix<floatPrec,3,1> p2 = lPair.second.first.head(3);
	Eigen::Matrix<floatPrec,3,1> m2 = dir2.cross(p2);
	// get plucker coordinates
	Eigen::Matrix<floatPrec,6,1> l1;
	l1.head(3) = dir1; l1.tail(3) = m1;
	Eigen::Matrix<floatPrec,6,1> l2;
	l2.head(3) = dir2; l2.tail(3) = m2;

	vector<Matrix<floatPrec, 6,1>> lines;
	lines.push_back(l1); lines.push_back(l2);

	return lines;
}